

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_read_data_zipx_bzip2(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  int iVar1;
  void *pvVar2;
  ulong request;
  long local_70;
  uint64_t total_out;
  wchar_t r;
  void *compressed_buff;
  ssize_t to_consume;
  ssize_t in_bytes;
  ssize_t bytes_avail;
  zip *zip;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  bytes_avail = (ssize_t)a->format->data;
  in_bytes = 0;
  zip = (zip *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if ((((zip *)bytes_avail)->decompress_init != '\0') ||
     (a_local._4_4_ = zipx_bzip2_init(a,(zip *)bytes_avail), a_local._4_4_ == L'\0')) {
    pvVar2 = __archive_read_ahead((archive_read *)buff_local,1,&in_bytes);
    if (in_bytes < 0) {
      archive_set_error((archive *)buff_local,0x54,"Truncated bzip2 file body");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      if (*(long *)(bytes_avail + 0x78) < in_bytes) {
        local_70 = *(long *)(bytes_avail + 0x78);
      }
      else {
        local_70 = in_bytes;
      }
      if (local_70 < 1) {
        archive_set_error((archive *)buff_local,0x54,"Truncated bzip2 file body");
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        *(void **)(bytes_avail + 0x1c0) = pvVar2;
        to_consume._0_4_ = (undefined4)local_70;
        *(undefined4 *)(bytes_avail + 0x1c8) = (undefined4)to_consume;
        *(undefined4 *)(bytes_avail + 0x1d0) = 0;
        *(undefined4 *)(bytes_avail + 0x1cc) = 0;
        *(undefined8 *)(bytes_avail + 0x1d8) = *(undefined8 *)(bytes_avail + 0xa8);
        *(undefined4 *)(bytes_avail + 0x1e0) = *(undefined4 *)(bytes_avail + 0xb0);
        *(undefined4 *)(bytes_avail + 0x1e8) = 0;
        *(undefined4 *)(bytes_avail + 0x1e4) = 0;
        iVar1 = BZ2_bzDecompress((bz_stream *)(bytes_avail + 0x1c0));
        if (iVar1 != 0) {
          if (iVar1 != 4) {
            archive_set_error((archive *)buff_local,-1,"bzip2 decompression failed");
            return L'\xffffffe2';
          }
          iVar1 = BZ2_bzDecompressEnd((bz_stream *)(bytes_avail + 0x1c0));
          if (iVar1 != 0) {
            archive_set_error((archive *)buff_local,-1,"Failed to clean up bzip2 decompressor");
            return L'\xffffffe2';
          }
          *(undefined1 *)(bytes_avail + 0xa2) = 1;
        }
        request = (ulong)*(uint *)(bytes_avail + 0x1cc);
        __archive_read_consume((archive_read *)buff_local,request);
        *(ulong *)(bytes_avail + 0x78) = *(long *)(bytes_avail + 0x78) - request;
        *(ulong *)(bytes_avail + 0x80) = request + *(long *)(bytes_avail + 0x80);
        *(long *)(bytes_avail + 0x88) =
             *(long *)(bytes_avail + 0x1e4) + *(long *)(bytes_avail + 0x88);
        *offset_local = *(long *)(bytes_avail + 0x1e4);
        *size_local = *(size_t *)(bytes_avail + 0xa8);
        a_local._4_4_ = consume_optional_marker((archive_read *)buff_local,(zip *)bytes_avail);
        if (a_local._4_4_ == L'\0') {
          a_local._4_4_ = L'\0';
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
zip_read_data_zipx_bzip2(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip = (struct zip *)(a->format->data);
	ssize_t bytes_avail = 0, in_bytes, to_consume;
	const void *compressed_buff;
	int r;
	uint64_t total_out;

	(void) offset; /* UNUSED */

	/* Initialize decompression context if we're here for the first time. */
	if(!zip->decompress_init) {
		r = zipx_bzip2_init(a, zip);
		if(r != ARCHIVE_OK)
			return r;
	}

	/* Fetch more compressed bytes. */
	compressed_buff = __archive_read_ahead(a, 1, &bytes_avail);
	if(bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated bzip2 file body");
		return (ARCHIVE_FATAL);
	}

	in_bytes = zipmin(zip->entry_bytes_remaining, bytes_avail);
	if(in_bytes < 1) {
		/* libbz2 doesn't complain when caller feeds avail_in == 0.
		 * It will actually return success in this case, which is
		 * undesirable. This is why we need to make this check
		 * manually. */

		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated bzip2 file body");
		return (ARCHIVE_FATAL);
	}

	/* Setup buffer boundaries. */
	zip->bzstream.next_in = (char*)(uintptr_t) compressed_buff;
	zip->bzstream.avail_in = (uint32_t)in_bytes;
	zip->bzstream.total_in_hi32 = 0;
	zip->bzstream.total_in_lo32 = 0;
	zip->bzstream.next_out = (char*) zip->uncompressed_buffer;
	zip->bzstream.avail_out = (uint32_t)zip->uncompressed_buffer_size;
	zip->bzstream.total_out_hi32 = 0;
	zip->bzstream.total_out_lo32 = 0;

	/* Perform the decompression. */
	r = BZ2_bzDecompress(&zip->bzstream);
	switch(r) {
		case BZ_STREAM_END:
			/* If we're at the end of the stream, deinitialize the
			 * decompression context now. */
			switch(BZ2_bzDecompressEnd(&zip->bzstream)) {
				case BZ_OK:
					break;
				default:
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Failed to clean up bzip2 "
					    "decompressor");
					return ARCHIVE_FATAL;
			}

			zip->end_of_entry = 1;
			break;
		case BZ_OK:
			/* The decompressor has successfully decoded this
			 * chunk of data, but more data is still in queue. */
			break;
		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "bzip2 decompression failed");
			return ARCHIVE_FATAL;
	}

	/* Update the pointers so decompressor can continue decoding. */
	to_consume = zip->bzstream.total_in_lo32;
	__archive_read_consume(a, to_consume);

	total_out = ((uint64_t) zip->bzstream.total_out_hi32 << 32) |
	    zip->bzstream.total_out_lo32;

	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += total_out;

	/* Give libarchive its due. */
	*size = total_out;
	*buff = zip->uncompressed_buffer;

	/* Seek for optional marker, like in other entries. */
	r = consume_optional_marker(a, zip);
	if(r != ARCHIVE_OK)
		return r;

	return ARCHIVE_OK;
}